

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_circle3d(rf_vec3 center,float radius,rf_vec3 rotation_axis,float rotationAngle,
                     rf_color color)

{
  _Bool _Var1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_38;
  undefined4 uStack_34;
  
  _Var1 = rf_gfx_check_buffer_limit(0x48);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_48 = center.x;
  uStack_44 = center.y;
  rf_gfx_translatef(local_48,uStack_44,center.z);
  local_38 = rotation_axis.x;
  uStack_34 = rotation_axis.y;
  rf_gfx_rotatef(rotationAngle,local_38,uStack_34,rotation_axis.z);
  rf_gfx_begin(RF_LINES);
  uVar2 = 0;
  while (uVar2 < 0x168) {
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    fVar3 = sinf((float)(long)uVar2 * 0.017453292);
    fVar4 = cosf((float)(long)uVar2 * 0.017453292);
    rf_gfx_vertex3f(fVar3 * radius,fVar4 * radius,0.0);
    uVar2 = uVar2 + 10;
    fVar3 = sinf((float)(long)uVar2 * 0.017453292);
    fVar4 = cosf((float)(long)uVar2 * 0.017453292);
    rf_gfx_vertex3f(fVar3 * radius,fVar4 * radius,0.0);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_circle3d(rf_vec3 center, float radius, rf_vec3 rotation_axis, float rotationAngle, rf_color color)
{
    if (rf_gfx_check_buffer_limit(2 * 36)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(center.x, center.y, center.z);
    rf_gfx_rotatef(rotationAngle, rotation_axis.x, rotation_axis.y, rotation_axis.z);

    rf_gfx_begin(RF_LINES);
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius, cosf(RF_DEG2RAD*i)*radius, 0.0f);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 10))*radius, cosf(RF_DEG2RAD*(i + 10))*radius, 0.0f);
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
}